

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::DeclaratorSyntax::setChild(DeclaratorSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  size_type sVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *pSVar8;
  EqualsValueClauseSyntax *pEVar9;
  logic_error *this_00;
  long *plVar10;
  size_type *psVar11;
  long *plVar12;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 2) {
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar7 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pEVar9 = (EqualsValueClauseSyntax *)0x0;
    }
    else {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pEVar9 = (EqualsValueClauseSyntax *)*ppSVar7;
      if ((pEVar9->super_SyntaxNode).kind != EqualsValueClause) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,
                   "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::EqualsValueClauseSyntax]"
                  );
      }
    }
    this->initializer = pEVar9;
  }
  else if (index == 1) {
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar8 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>>
                       (*ppSVar7);
    (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar8->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar8->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->dimensions).super_SyntaxListBase.childCount = (pSVar8->super_SyntaxListBase).childCount;
    sVar2 = (pSVar8->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
            size_;
    (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
    data_ = (pSVar8->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
            data_;
    (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
    size_ = sVar2;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar10 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar10;
      psVar11 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar10[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
      }
      local_d0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::to_string(&local_70,0xe76);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar10;
      plVar12 = plVar10 + 2;
      if (local_b0 == plVar12) {
        local_a0 = *plVar12;
        lStack_98 = plVar10[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar12;
      }
      local_a8 = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar10;
      plVar12 = plVar10 + 2;
      if (local_f0 == plVar12) {
        local_e0 = *plVar12;
        lStack_d8 = plVar10[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar12;
      }
      local_e8 = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->name).kind = pvVar6->kind;
    (this->name).field_0x2 = uVar3;
    (this->name).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->name).rawLen = uVar5;
    (this->name).info = pIVar1;
  }
  return;
}

Assistant:

void DeclaratorSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: dimensions = child.node()->as<SyntaxList<VariableDimensionSyntax>>(); return;
        case 2: initializer = child.node() ? &child.node()->as<EqualsValueClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}